

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_core.c
# Opt level: O0

int ossl_provider_up_ref(OSSL_PROVIDER *prov)

{
  int iVar1;
  OSSL_PROVIDER *in_RDI;
  int ref;
  int local_14;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_14 = 0;
  iVar1 = CRYPTO_UP_REF(&in_RDI->refcnt,&local_14,in_RDI->refcnt_lock);
  if (iVar1 < 1) {
    local_14 = 0;
  }
  else if (((in_RDI->field_0xc8 & 1) != 0) &&
          (iVar1 = ossl_provider_up_ref_parent
                             ((OSSL_PROVIDER *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (int)((ulong)in_RDI >> 0x20)), iVar1 == 0)) {
    ossl_provider_free(in_RDI);
    local_14 = 0;
  }
  return local_14;
}

Assistant:

int ossl_provider_up_ref(OSSL_PROVIDER *prov)
{
    int ref = 0;

    if (CRYPTO_UP_REF(&prov->refcnt, &ref, prov->refcnt_lock) <= 0)
        return 0;

#ifndef FIPS_MODULE
    if (prov->ischild) {
        if (!ossl_provider_up_ref_parent(prov, 0)) {
            ossl_provider_free(prov);
            return 0;
        }
    }
#endif

    return ref;
}